

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O1

internal_exr_unpack_fn
internal_exr_match_decode
          (exr_decode_pipeline_t *decode,int isdeep,int chanstofill,int chanstounpack,int sametype,
          int sameouttype,int samebpc,int sameoutbpc,int hassampling,int hastypechange,
          int sameoutinc,int simpinterleave,int simpinterleaverev,int simplineoff)

{
  short sVar1;
  code *pcVar2;
  code *pcVar3;
  
  if (internal_exr_match_decode_init_cpu_check == '\0') {
    internal_exr_match_decode_init_cpu_check = '\x01';
  }
  if (isdeep == 0) {
    if (hastypechange < 1) {
      pcVar2 = generic_unpack;
      if ((((hassampling == 0) && (0 < sameoutbpc)) && (0 < samebpc)) &&
         (sVar1 = decode->channel_count, sVar1 == chanstofill)) {
        if (samebpc == 4) {
          return unpack_32bit;
        }
        if (samebpc == 2) {
          if (0 < simpinterleave) {
            if (sVar1 == 4) {
              return unpack_16bit_4chan_interleave;
            }
            if (sVar1 == 3) {
              return unpack_16bit_3chan_interleave;
            }
          }
          if (0 < simpinterleaverev) {
            if (sVar1 == 4) {
              return unpack_16bit_4chan_interleave_rev;
            }
            if (sVar1 == 3) {
              return unpack_16bit_3chan_interleave_rev;
            }
          }
          if (sameoutinc == 2) {
            if (sVar1 == 4) {
              return unpack_16bit_4chan_planar;
            }
            if (sVar1 == 3) {
              return unpack_16bit_3chan_planar;
            }
          }
          pcVar2 = unpack_16bit;
          if (sVar1 == 3) {
            pcVar2 = unpack_16bit_3chan;
          }
          pcVar3 = unpack_16bit_4chan;
          goto LAB_00126d87;
        }
      }
    }
    else {
      pcVar2 = generic_unpack;
      if (sameouttype == 2 && sametype == 1) {
        if (0 < simpinterleave) {
          if (decode->channel_count == 4) {
            return unpack_half_to_float_4chan_interleave;
          }
          if (decode->channel_count == 3) {
            return unpack_half_to_float_3chan_interleave;
          }
        }
        if (0 < simpinterleaverev) {
          if (decode->channel_count == 4) {
            return unpack_half_to_float_4chan_interleave_rev;
          }
          if (decode->channel_count == 3) {
            return unpack_half_to_float_3chan_interleave_rev;
          }
        }
        if (sameoutinc == 4) {
          sVar1 = decode->channel_count;
          pcVar2 = generic_unpack;
          if (sVar1 == 3) {
            pcVar2 = unpack_half_to_float_3chan_planar;
          }
          pcVar3 = unpack_half_to_float_4chan_planar;
LAB_00126d87:
          if (sVar1 != 4) {
            pcVar3 = pcVar2;
          }
          return pcVar3;
        }
      }
    }
  }
  else {
    pcVar2 = generic_unpack_deep_pointers;
    if ((decode->decode_flags & 1) == 0) {
      pcVar2 = generic_unpack_deep;
    }
  }
  return pcVar2;
}

Assistant:

internal_exr_unpack_fn
internal_exr_match_decode (
    exr_decode_pipeline_t* decode,
    int                    isdeep,
    int                    chanstofill,
    int                    chanstounpack,
    int                    sametype,
    int                    sameouttype,
    int                    samebpc,
    int                    sameoutbpc,
    int                    hassampling,
    int                    hastypechange,
    int                    sameoutinc,
    int                    simpinterleave,
    int                    simpinterleaverev,
    int                    simplineoff)
{
    static int init_cpu_check = 1;
    if (init_cpu_check)
    {
        choose_half_to_float_impl ();
        init_cpu_check = 0;
    }

    if (isdeep)
    {
        if ((decode->decode_flags & EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
            return &generic_unpack_deep_pointers;
        return &generic_unpack_deep;
    }

    if (hastypechange > 0)
    {
        /* other optimizations would not be difficult, but this will
         * be the common one (where on encode / pack we want to do the
         * opposite) */
        if (sametype == (int) EXR_PIXEL_HALF &&
            sameouttype == (int) EXR_PIXEL_FLOAT)
        {
            if (simpinterleave > 0)
            {
                if (decode->channel_count == 4)
                    return &unpack_half_to_float_4chan_interleave;
                if (decode->channel_count == 3)
                    return &unpack_half_to_float_3chan_interleave;
            }

            if (simpinterleaverev > 0)
            {
                if (decode->channel_count == 4)
                    return &unpack_half_to_float_4chan_interleave_rev;
                if (decode->channel_count == 3)
                    return &unpack_half_to_float_3chan_interleave_rev;
            }

            if (sameoutinc == 4)
            {
                if (decode->channel_count == 4)
                    return &unpack_half_to_float_4chan_planar;
                if (decode->channel_count == 3)
                    return &unpack_half_to_float_3chan_planar;
            }
        }

        return &generic_unpack;
    }

    if (hassampling || chanstofill != decode->channel_count || samebpc <= 0 ||
        sameoutbpc <= 0)
        return &generic_unpack;

    (void) chanstounpack;
    (void) simplineoff;

    if (samebpc == 2)
    {
        if (simpinterleave > 0)
        {
            if (decode->channel_count == 4)
                return &unpack_16bit_4chan_interleave;
            if (decode->channel_count == 3)
                return &unpack_16bit_3chan_interleave;
        }

        if (simpinterleaverev > 0)
        {
            if (decode->channel_count == 4)
                return &unpack_16bit_4chan_interleave_rev;
            if (decode->channel_count == 3)
                return &unpack_16bit_3chan_interleave_rev;
        }

        if (sameoutinc == 2)
        {
            if (decode->channel_count == 4) return &unpack_16bit_4chan_planar;
            if (decode->channel_count == 3) return &unpack_16bit_3chan_planar;
        }

        if (decode->channel_count == 4) return &unpack_16bit_4chan;
        if (decode->channel_count == 3) return &unpack_16bit_3chan;

        return &unpack_16bit;
    }

    if (samebpc == 4)
    {
        //if (decode->channel_count == 4) return &unpack_32bit_4chan;
        //if (decode->channel_count == 3) return &unpack_32bit_3chan;
        return &unpack_32bit;
    }

    return &generic_unpack;
}